

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SyntaxDumper.h
# Opt level: O1

Action __thiscall
psy::C::SyntaxDumper::visitExtGNU_Typeof(SyntaxDumper *this,ExtGNU_TypeofSyntax *node)

{
  SyntaxToken local_50;
  
  SyntaxNode::tokenAtIndex(&local_50,(SyntaxNode *)node,node->typeofKwTkIdx_);
  (*(this->super_SyntaxVisitor)._vptr_SyntaxVisitor[0x5d])(this,&local_50,node);
  SyntaxToken::~SyntaxToken(&local_50);
  (*(this->super_SyntaxVisitor)._vptr_SyntaxVisitor[0x5e])(this,node->tyRef_);
  return Skip;
}

Assistant:

virtual Action visitExtGNU_Typeof(const ExtGNU_TypeofSyntax* node) override
    {
        terminal(node->typeofKeyword(), node);
        nonterminal(node->tyReference());
        return Action::Skip;
    }